

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O2

bool WTF::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,off_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Xword EVar1;
  Elf64_Addr EVar2;
  Elf64_Off EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  Elf64_Word EVar6;
  Elf64_Word EVar7;
  Elf64_Word EVar8;
  Elf64_Word EVar9;
  Elf64_Word *pEVar10;
  ulong uVar11;
  long lVar12;
  size_t count;
  Elf64_Word *pEVar13;
  undefined6 in_register_00000032;
  int iVar14;
  int iVar15;
  Elf64_Shdr buf [16];
  undefined1 local_438 [4];
  Elf64_Word aEStack_434 [257];
  
  iVar14 = 0;
  do {
    iVar15 = (int)CONCAT62(in_register_00000032,sh_num);
    if (iVar15 - iVar14 == 0 || iVar15 < iVar14) {
LAB_00107ae2:
      return iVar14 < iVar15;
    }
    count = (long)(iVar15 - iVar14) << 6;
    if (0x3ff < count) {
      count = 0x400;
    }
    uVar11 = ReadFromOffset(fd,local_438,count,(long)iVar14 * 0x40 + sh_offset);
    if (((uVar11 & 0x3f) != 0) || (0x43f < uVar11)) {
      abort();
    }
    lVar12 = (uVar11 >> 6) + 1;
    pEVar10 = aEStack_434;
    while (pEVar13 = pEVar10, lVar12 = lVar12 + -1, lVar12 != 0) {
      pEVar10 = pEVar13 + 0x10;
      if (*pEVar13 == type) {
        EVar8 = pEVar13[-1];
        EVar9 = pEVar13[0];
        EVar1 = *(Elf64_Xword *)(pEVar13 + 1);
        EVar2 = *(Elf64_Addr *)(pEVar13 + 3);
        EVar3 = *(Elf64_Off *)(pEVar13 + 5);
        EVar4 = *(Elf64_Xword *)(pEVar13 + 7);
        EVar6 = pEVar13[9];
        EVar7 = pEVar13[10];
        EVar5 = *(Elf64_Xword *)(pEVar13 + 0xd);
        out->sh_addralign = *(Elf64_Xword *)(pEVar13 + 0xb);
        out->sh_entsize = EVar5;
        out->sh_size = EVar4;
        out->sh_link = EVar6;
        out->sh_info = EVar7;
        out->sh_addr = EVar2;
        out->sh_offset = EVar3;
        out->sh_name = EVar8;
        out->sh_type = EVar9;
        out->sh_flags = EVar1;
        goto LAB_00107ae2;
      }
    }
    iVar14 = iVar14 + (int)(uVar11 >> 6);
  } while( true );
}

Assistant:

static bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const off_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (int i = 0; i < sh_num;) {
    const ssize_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const ssize_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_headers_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (int j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}